

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

Environment * iutest::TestEnv::AddGlobalTestEnvironment(Environment *env)

{
  iuEnvironmentList *this;
  Environment *local_18;
  Environment *env_local;
  
  if (env == (Environment *)0x0) {
    env_local = (Environment *)0x0;
  }
  else {
    local_18 = env;
    this = environments();
    std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::push_back
              (this,&local_18);
    env_local = local_18;
  }
  return env_local;
}

Assistant:

static Environment* AddGlobalTestEnvironment(Environment* env)
    {
        if( env == NULL )
        {
            return NULL;
        }
        environments().push_back(env);
        return env;
    }